

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IAbstractReader.cpp
# Opt level: O1

void __thiscall
IAbstractReader::IAbstractReader
          (IAbstractReader *this,ifstream *ifs,ostream *os,int deep,bool silence)

{
  this->_vptr_IAbstractReader = (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  (this->m_dataType)._M_dataplus._M_p = (pointer)&(this->m_dataType).field_2;
  (this->m_dataType)._M_string_length = 0;
  (this->m_dataType).field_2._M_local_buf[0] = '\0';
  this->m_silence = silence;
  this->m_ifs = ifs;
  this->m_deep = deep;
  this->m_os = os;
  std::__cxx11::string::_M_replace((ulong)&this->m_dataType,0,(char *)0x0,0x10c0ac);
  return;
}

Assistant:

IAbstractReader::IAbstractReader(std::ifstream* ifs, std::ostream* os, int deep,bool silence) {
    m_silence = silence;
    m_ifs = ifs;
    m_deep = deep;
    m_os = os;
    m_dataType = "Object";
}